

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O0

object get_float_data(SRUP_MSG_DATA *self)

{
  float *x;
  SRUP_MSG_DATA *in_RSI;
  float *rv;
  SRUP_MSG_DATA *self_local;
  
  x = SRUP_MSG_DATA::data_float(in_RSI);
  if (x == (float *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<float>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_float_data(SRUP_MSG_DATA& self)
{
    float* rv;
    rv = self.data_float();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();

}